

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_writer_utils.c
# Opt level: O0

void VP8LPutBitsFlushBits(VP8LBitWriter *bw)

{
  int iVar1;
  ulong *in_RDI;
  uint64_t extra_size;
  VP8LBitWriter *in_stack_00000018;
  
  if ((in_RDI[4] < in_RDI[3] + 4) &&
     ((iVar1 = CheckSizeOverflow((in_RDI[4] - in_RDI[2]) + 0x8000), iVar1 == 0 ||
      (iVar1 = VP8LBitWriterResize(in_stack_00000018,(size_t)bw), iVar1 == 0)))) {
    in_RDI[3] = in_RDI[2];
    *(undefined4 *)(in_RDI + 5) = 1;
  }
  else {
    *(int *)in_RDI[3] = (int)*in_RDI;
    in_RDI[3] = in_RDI[3] + 4;
    *in_RDI = *in_RDI >> 0x20;
    *(int *)(in_RDI + 1) = (int)in_RDI[1] + -0x20;
  }
  return;
}

Assistant:

void VP8LPutBitsFlushBits(VP8LBitWriter* const bw) {
  // If needed, make some room by flushing some bits out.
  if (bw->cur + VP8L_WRITER_BYTES > bw->end) {
    const uint64_t extra_size = (bw->end - bw->buf) + MIN_EXTRA_SIZE;
    if (!CheckSizeOverflow(extra_size) ||
        !VP8LBitWriterResize(bw, (size_t)extra_size)) {
      bw->cur = bw->buf;
      bw->error = 1;
      return;
    }
  }
  *(vp8l_wtype_t*)bw->cur = (vp8l_wtype_t)WSWAP((vp8l_wtype_t)bw->bits);
  bw->cur += VP8L_WRITER_BYTES;
  bw->bits >>= VP8L_WRITER_BITS;
  bw->used -= VP8L_WRITER_BITS;
}